

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
HandleLogicalArgs<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                 *con,int param_3)

{
  undefined4 in_EDX;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *in_RSI;
  function<void_(int)> *in_stack_ffffffffffffffb8;
  function<void_(int)> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::function<void_(int)>::function(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VisitArguments<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
            (in_RSI,(function<void_(int)> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::function<void_(int)>::~function((function<void_(int)> *)0x2f205d);
  return false;
}

Assistant:

bool HandleLogicalArgs(const Con& con, int ) {
    VisitArguments(con, MarkVarIfLogical_);          // Mark as proper vars
    return false;                                    // don't remove immediately
  }